

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_add_mhmarker_v2(opj_codestream_index_t *cstr_index,OPJ_UINT32 type,OPJ_OFF_T pos,
                        OPJ_UINT32 len)

{
  void *pvVar1;
  undefined4 in_ECX;
  int in_EDX;
  undefined2 in_SI;
  long in_RDI;
  
  if (*(uint *)(in_RDI + 0x28) < *(int *)(in_RDI + 0x18) + 1U) {
    *(int *)(in_RDI + 0x28) = (int)((float)*(uint *)(in_RDI + 0x28) * 1.0) + 100;
    pvVar1 = realloc(*(void **)(in_RDI + 0x20),(ulong)*(uint *)(in_RDI + 0x28) * 0x18);
    *(void **)(in_RDI + 0x20) = pvVar1;
  }
  *(undefined2 *)(*(long *)(in_RDI + 0x20) + (ulong)*(uint *)(in_RDI + 0x18) * 0x18) = in_SI;
  *(long *)(*(long *)(in_RDI + 0x20) + (ulong)*(uint *)(in_RDI + 0x18) * 0x18 + 8) = (long)in_EDX;
  *(undefined4 *)(*(long *)(in_RDI + 0x20) + (ulong)*(uint *)(in_RDI + 0x18) * 0x18 + 0x10) = in_ECX
  ;
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

static void j2k_add_mhmarker_v2(opj_codestream_index_t *cstr_index, OPJ_UINT32 type, OPJ_OFF_T pos, OPJ_UINT32 len)
{
	assert(cstr_index != 00);

	/* expand the list? */
	if ((cstr_index->marknum + 1) > cstr_index->maxmarknum) {
		cstr_index->maxmarknum = 100 + (int) ((float) cstr_index->maxmarknum * 1.0F);
		cstr_index->marker = (opj_marker_info_t*)opj_realloc(cstr_index->marker, cstr_index->maxmarknum *sizeof(opj_marker_info_t));
	}

	/* add the marker */
	cstr_index->marker[cstr_index->marknum].type = (OPJ_UINT16)type;
	cstr_index->marker[cstr_index->marknum].pos = (OPJ_INT32)pos;
	cstr_index->marker[cstr_index->marknum].len = (OPJ_INT32)len;
	cstr_index->marknum++;

}